

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::ClientWaitForeverFlushTest::iterate(ClientWaitForeverFlushTest *this)

{
  deUint32 dVar1;
  deBool dVar2;
  EGLSyncKHR pvVar3;
  MessageBuilder *pMVar4;
  TestError *this_00;
  MessageBuilder local_4c8;
  int local_344;
  undefined1 local_340 [4];
  EGLint status;
  uint local_1bc;
  char *pcStack_1b8;
  EGLBoolean ret;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  Library *egl;
  ClientWaitForeverFlushTest *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  local_20 = tcu::TestContext::getLog
                       ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  pvVar3 = (EGLSyncKHR)
           (*(code *)log->m_log[3].outputFile)
                     (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_syncType,0);
  (this->super_SyncTest).m_sync = pvVar3;
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1a0,&(this->super_SyncTest).m_sync);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])" = eglCreateSyncKHR(");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pcStack_1b8 = getSyncTypeName((this->super_SyncTest).m_syncType);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stack0xfffffffffffffe48);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [8])0x580c83);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  dVar1 = (*(code *)log->m_log[6].lock)();
  eglu::checkError(dVar1,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x24d);
  if ((this->super_SyncTest).m_syncType == 0x30fa) {
    local_1bc = (*(code *)log->m_log[9].outputFile)
                          (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_sync,
                           0x30f2);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_340,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_340,&local_1bc);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])" = eglSignalSyncKHR(");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_sync);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [20])", EGL_SIGNALED_KHR)");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_340);
    dVar1 = (*(code *)log->m_log[6].lock)();
    eglu::checkError(dVar1,"eglSignalSyncKHR()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                     ,0x253);
  }
  local_344 = (**(code **)&log->m_log->isSessionOpen)
                        (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_sync,1,
                         0xffffffffffffffff);
  tcu::TestLog::operator<<(&local_4c8,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_4c8,&local_344);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])" = eglClientWaitSyncKHR(");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_sync);
  pMVar4 = tcu::MessageBuilder::operator<<
                     (pMVar4,(char (*) [52])", EGL_SYNC_FLUSH_COMMANDS_BIT_KHR, EGL_FOREVER_KHR)");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4c8);
  while( true ) {
    dVar2 = ::deGetFalse();
    if ((dVar2 != 0) || (local_344 != 0x30f6)) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      tcu::TestContext::setTestResult
                ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"status == EGL_CONDITION_SATISFIED_KHR",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
             ,0x259);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult	iterate						(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		if (m_syncType == EGL_SYNC_REUSABLE_KHR)
		{
			EGLBoolean ret = egl.signalSyncKHR(m_eglDisplay, m_sync, EGL_SIGNALED_KHR);
			log << TestLog::Message << ret << " = eglSignalSyncKHR(" << m_eglDisplay << ", " << m_sync << ", EGL_SIGNALED_KHR)" << TestLog::EndMessage;
			EGLU_CHECK_MSG(egl, "eglSignalSyncKHR()");
		}

		EGLint status = egl.clientWaitSyncKHR(m_eglDisplay, m_sync, EGL_SYNC_FLUSH_COMMANDS_BIT_KHR, EGL_FOREVER_KHR);
		log << TestLog::Message << status << " = eglClientWaitSyncKHR(" << m_eglDisplay << ", " << m_sync << ", EGL_SYNC_FLUSH_COMMANDS_BIT_KHR, EGL_FOREVER_KHR)" << TestLog::EndMessage;

		TCU_CHECK(status == EGL_CONDITION_SATISFIED_KHR);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}